

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int parse_config_file(char *fn)

{
  int iVar1;
  uint kw;
  int iVar2;
  int nargs;
  parse_state state;
  char *args [64];
  parse_state local_268;
  char *local_238 [65];
  
  local_268.ptr = (char *)read_file(fn,(uint *)0x0);
  if (local_268.ptr == (char *)0x0) {
    iVar2 = -1;
  }
  else {
    local_268.line = 1;
    local_268.nexttoken = 0;
    local_268.parse_line = parse_line_no_op;
    local_268.filename = fn;
    iVar2 = 0;
    while( true ) {
      while (nargs = iVar2, iVar1 = next_token(&local_268), iVar2 = nargs, iVar1 == 1) {
        if (nargs < 0x40) {
          local_238[nargs] = local_268.text;
          iVar2 = nargs + 1;
        }
      }
      if (iVar1 == 0) break;
      if ((iVar1 == 2) && (iVar2 = 0, nargs != 0)) {
        kw = lookup_keyword(local_238[0]);
        if ((keyword_info[kw].flags & 1) == 0) {
          (*local_268.parse_line)(&local_268,nargs,local_238);
        }
        else {
          (*local_268.parse_line)(&local_268,0,(char **)0x0);
          parse_new_section(&local_268,kw,nargs,local_238);
          iVar2 = 0;
        }
      }
    }
    iVar2 = 0;
    (*local_268.parse_line)(&local_268,0,(char **)0x0);
  }
  return iVar2;
}

Assistant:

int parse_config_file(const char *fn)
{
    char *data;
    data = read_file(fn, 0);
    if (!data) return -1;

    parse_config(fn, data);
    DUMP();
    return 0;
}